

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void crnlib::
     hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
     ::construct_value_type(value_type *pDst,value_type *pSrc)

{
  value_type *pSrc_local;
  value_type *pDst_local;
  
  *pDst = *pSrc;
  return;
}

Assistant:

static inline void construct_value_type(value_type* pDst, const value_type* pSrc)
        {
            if ((CRNLIB_IS_BITWISE_COPYABLE(Key)) && (CRNLIB_IS_BITWISE_COPYABLE(Value)))
            {
                memcpy(pDst, pSrc, sizeof(value_type));
            }
            else
            {
                if (CRNLIB_IS_BITWISE_COPYABLE(Key))
                {
                    memcpy(&pDst->first, &pSrc->first, sizeof(Key));
                }
                else
                {
                    scalar_type<Key>::construct(&pDst->first, pSrc->first);
                }

                if (CRNLIB_IS_BITWISE_COPYABLE(Value))
                {
                    memcpy(&pDst->second, &pSrc->second, sizeof(Value));
                }
                else
                {
                    scalar_type<Value>::construct(&pDst->second, pSrc->second);
                }
            }
        }